

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O3

void do_control_channel_controllers_off(_mdi *mdi,_event_data *data)

{
  ulong uVar1;
  uchar ch;
  
  uVar1 = (ulong)(((uint)data & 0xff) * 0x30);
  *(undefined2 *)(&mdi->channel[0].pressure + uVar1) = 0x7f7f;
  *(undefined2 *)((long)&mdi->channel[0].reg_data + uVar1) = 0xffff;
  *(undefined4 *)((long)&mdi->channel[0].pitch + uVar1) = 0xc80000;
  *(undefined8 *)((long)&mdi->channel[0].pitch_adjust + uVar1) = 0;
  (&mdi->channel[0].hold)[uVar1] = '\0';
  _WM_AdjustChannelVolumes(mdi,(uchar)data);
  return;
}

Assistant:

static void do_control_channel_controllers_off(struct _mdi *mdi,
		struct _event_data *data) {
	struct _note *note_data = mdi->note;
	unsigned char ch = data->channel;

	mdi->channel[ch].expression = 127;
	mdi->channel[ch].pressure = 127;
	mdi->channel[ch].reg_data = 0xffff;
	mdi->channel[ch].pitch_range = 200;
	mdi->channel[ch].pitch = 0;
	mdi->channel[ch].pitch_adjust = 0;
	mdi->channel[ch].hold = 0;

	_WM_AdjustChannelVolumes(mdi, ch);
}